

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O1

int __thiscall CCEXP::CCEXPMat<int>::DeleteRow(CCEXPMat<int> *this,size_t row)

{
  int iVar1;
  
  iVar1 = 0;
  if (this->IgnoreM == false) {
    iVar1 = -9999;
    CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",0x188,
                   "CCEXPMat::DeleteRow():: DeleteRow() is not supported with \'__CCEXP__USE_VECTOR_INSTEAD_OF_LIST\' enabled!"
                  );
  }
  return iVar1;
}

Assistant:

int CCEXPMat<T>::DeleteRow(size_t row) {
	if (IgnoreM) return 0;
	#ifdef __CCEXP__USE_VECTOR_INSTEAD_OF_LIST
		CECS_ERRI(CCEXPECS, 1, "CCEXPMat::DeleteRow():: DeleteRow() is not supported with '__CCEXP__USE_VECTOR_INSTEAD_OF_LIST' enabled!");
	#else
		const size_t N = data.size();
		CECS_ERRI(CCEXPECS,row >= N,"CCEXPMat::DeleteRow():: Requested Row is not exist yet! (row(=" __ZU__ ") >= N(=" __ZU__ "))", row, N);	
		auto it = std::next(data.begin(), row);
		data.erase(it);
	#endif
	return 0;
}